

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionally_enabled_mutex.hpp
# Opt level: O0

void __thiscall
asio::detail::conditionally_enabled_mutex::scoped_lock::scoped_lock
          (scoped_lock *this,conditionally_enabled_mutex *m)

{
  conditionally_enabled_mutex *m_local;
  scoped_lock *this_local;
  
  noncopyable::noncopyable((noncopyable *)this);
  this->mutex_ = m;
  if ((m->enabled_ & 1U) == 0) {
    this->locked_ = false;
  }
  else {
    posix_mutex::lock(&this->mutex_->mutex_);
    this->locked_ = true;
  }
  return;
}

Assistant:

explicit scoped_lock(conditionally_enabled_mutex& m)
      : mutex_(m)
    {
      if (m.enabled_)
      {
        mutex_.mutex_.lock();
        locked_ = true;
      }
      else
        locked_ = false;
    }